

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

JSON_Status json_array_resize(JSON_Array *array,size_t new_capacity)

{
  JSON_Value **__dest;
  JSON_Status JVar1;
  JSON_Value **__src;
  
  JVar1 = -1;
  if (new_capacity != 0) {
    __dest = (JSON_Value **)(*parson_malloc)(new_capacity * 8);
    if (__dest != (JSON_Value **)0x0) {
      __src = array->items;
      JVar1 = 0;
      if (__src == (JSON_Value **)0x0) {
        __src = (JSON_Value **)0x0;
      }
      else if (array->count != 0) {
        memcpy(__dest,__src,array->count << 3);
        __src = array->items;
      }
      (*parson_free)(__src);
      array->items = __dest;
      array->capacity = new_capacity;
    }
  }
  return JVar1;
}

Assistant:

static JSON_Status json_array_resize(JSON_Array *array, size_t new_capacity) {
    JSON_Value **new_items = NULL;
    if (new_capacity == 0) {
        return JSONFailure;
    }
    new_items = (JSON_Value**)parson_malloc(new_capacity * sizeof(JSON_Value*));
    if (new_items == NULL) {
        return JSONFailure;
    }
    if (array->items != NULL && array->count > 0) {
        memcpy(new_items, array->items, array->count * sizeof(JSON_Value*));
    }
    parson_free(array->items);
    array->items = new_items;
    array->capacity = new_capacity;
    return JSONSuccess;
}